

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
Table<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
::Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
          *table,size_t pos,Entry *row,uint skip)

{
  Entry *pEVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  ArrayPtr<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table_00;
  Maybe<unsigned_long> MVar2;
  bool local_61;
  size_t local_60;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_58;
  
  if (skip == 0) {
    *this = (Impl<0UL,_false>)0x0;
  }
  else {
    pEVar1 = (table->rows).builder.ptr;
    table_00.size_ = (size_t)pEVar1;
    table_00.ptr = (Entry *)&table->indexes;
    local_60 = pos;
    MVar2 = HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
            insert<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,unsigned_long&>
                      ((HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> *)
                       &local_58,table_00,(long)(table->rows).builder.pos - (long)pEVar1 >> 4,
                       (unsigned_long *)pos);
    pos = (size_t)MVar2.ptr.field_1;
    if ((HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)
        local_58.maybeFunc.ptr.isSet ==
        (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x1) {
      *this = (Impl<0UL,_false>)0x1;
      *(bool **)(this + 8) = local_58.maybeFunc.ptr.field_1.value.success;
    }
    else {
      local_58.maybeFunc.ptr.isSet = true;
      local_58.maybeFunc.ptr.field_1.value.success = &local_61;
      local_58.maybeFunc.ptr.field_1.value.pos = &local_60;
      *this = (Impl<0UL,_false>)0x0;
      local_61 = true;
      local_58.maybeFunc.ptr.field_1.value.indexObj =
           (TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks> *)&table->indexes;
      local_58.maybeFunc.ptr.field_1.value.table =
           (Table<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry,_kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>_>
            *)table;
      local_58.maybeFunc.ptr.field_1.value.row = (Entry *)row;
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
      ::run(&local_58);
      pos = (size_t)extraout_RDX;
    }
  }
  MVar2.ptr.field_1.value = pos;
  MVar2.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar2.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }